

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip38.c
# Opt level: O0

int get_flags(char *bip38,uchar *bytes,size_t bytes_len,size_t *written)

{
  int iVar1;
  size_t sStack_68;
  int ret;
  size_t serialized_len;
  bip38_layout_t buf;
  size_t *written_local;
  size_t bytes_len_local;
  uchar *bytes_local;
  char *bip38_local;
  
  if (written == (size_t *)0x0) {
    return -2;
  }
  *written = 0;
  buf._36_8_ = written;
  if (bytes == (uchar *)0x0) {
    iVar1 = wally_base58_to_bytes
                      (bip38,1,(uchar *)((long)&serialized_len + 5),0x2b,&stack0xffffffffffffff98);
    if (iVar1 != 0) {
      return iVar1;
    }
    if (sStack_68 != 0x27) {
      return -2;
    }
  }
  else {
    if (bytes_len != 0x27) {
      return -2;
    }
    memcpy((void *)((long)&serialized_len + 5),bytes,0x27);
  }
  iVar1 = 0;
  if (serialized_len._6_1_ != 'B') {
    iVar1 = 0x200;
  }
  *(long *)buf._36_8_ = (long)iVar1;
  iVar1 = 0;
  if ((serialized_len._7_1_ & 0x20) != 0) {
    iVar1 = 0x100;
  }
  *(ulong *)buf._36_8_ = (long)iVar1 | *(ulong *)buf._36_8_;
  wally_clear((void *)((long)&serialized_len + 4),0x2c);
  return 0;
}

Assistant:

static int get_flags(const char *bip38,
                     const unsigned char *bytes, size_t bytes_len,
                     size_t *written)
{
    struct bip38_layout_t buf;

    if (!written)
        return WALLY_EINVAL;

    *written = 0;

    if (bytes) {
        if (bytes_len != BIP38_SERIALIZED_LEN)
            return WALLY_EINVAL;
        memcpy(&buf.prefix, bytes, BIP38_SERIALIZED_LEN);
    } else {
        size_t serialized_len;
        int ret;
        if ((ret = wally_base58_to_bytes(bip38, BASE58_FLAG_CHECKSUM, &buf.prefix,
                                         BIP38_SERIALIZED_LEN + BASE58_CHECKSUM_LEN,
                                         &serialized_len)))
            return ret;

        if (serialized_len != BIP38_SERIALIZED_LEN)
            return WALLY_EINVAL;
    }

    *written = buf.ec_type != BIP38_NO_ECMUL ? BIP38_KEY_EC_MULT : 0;
    *written |= buf.flags & BIP38_FLAG_COMPRESSED ? BIP38_KEY_COMPRESSED : 0;

    wally_clear(&buf, sizeof(buf));

    return WALLY_OK;
}